

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGhsMultiGenerator::ComputeTargetBuildOrder
          (cmGlobalGhsMultiGenerator *this,cmGeneratorTarget *tgt,
          vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *build)

{
  initializer_list<const_cmGeneratorTarget_*> __l;
  bool bVar1;
  allocator<const_cmGeneratorTarget_*> local_51;
  cmGeneratorTarget *local_50;
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> t;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *build_local;
  cmGeneratorTarget *tgt_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  local_48 = &local_50;
  local_40 = 1;
  local_50 = tgt;
  t.super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)build;
  std::allocator<const_cmGeneratorTarget_*>::allocator(&local_51);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::vector
            ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
             local_38,__l,&local_51);
  std::allocator<const_cmGeneratorTarget_*>::~allocator(&local_51);
  bVar1 = ComputeTargetBuildOrder
                    (this,(vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                           *)local_38,
                     (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                      *)t.
                        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::~vector
            ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
             local_38);
  return bVar1;
}

Assistant:

bool cmGlobalGhsMultiGenerator::ComputeTargetBuildOrder(
  cmGeneratorTarget const* tgt, std::vector<cmGeneratorTarget const*>& build)
{
  std::vector<cmGeneratorTarget const*> t{ tgt };
  return this->ComputeTargetBuildOrder(t, build);
}